

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O1

bool __thiscall QDeviceDiscoveryUDev::checkDeviceType(QDeviceDiscoveryUDev *this,udev_device *dev)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  storage_type *psVar7;
  byte bVar8;
  storage_type *psVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QStringView QVar11;
  bool ok;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (dev != (udev_device *)0x0) {
    if (((byte)this[0x10] & 8) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_KEYBOARD");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) {
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_58 = 0xaaaaaaaa;
        uStack_54 = 0xaaaaaaaa;
        uStack_50 = 0xaaaaaaaa;
        uStack_4c = 0xaaaaaaaa;
        lVar6 = udev_device_get_sysattr_value(dev);
        if (lVar6 == 0) {
          psVar9 = (storage_type *)0x0;
        }
        else {
          psVar7 = (storage_type *)0xffffffffffffffff;
          do {
            psVar9 = psVar7 + 1;
            pcVar5 = psVar7 + lVar6 + 1;
            psVar7 = psVar9;
          } while (*pcVar5 != '\0');
        }
        QVar10.m_data = psVar9;
        QVar10.m_size = (qsizetype)&local_58;
        QString::fromUtf8(QVar10);
        local_68 = -0x5555555555555556;
        local_78 = 0xaaaaaaaa;
        uStack_74 = 0xaaaaaaaa;
        uStack_70 = 0xaaaaaaaa;
        uStack_6c = 0xaaaaaaaa;
        local_80 = CONCAT44(uStack_4c,uStack_50);
        local_88 = local_48;
        QStringView::split(&local_78,&local_88,0x20,1,1);
        if (local_68 == 0) {
          bVar8 = 1;
        }
        else {
          local_88 = CONCAT71(local_88._1_7_,0xaa);
          QVar11.m_data =
               *(storage_type_conflict **)(CONCAT44(uStack_6c,uStack_70) + -8 + local_68 * 0x10);
          QVar11.m_size = *(qsizetype *)(CONCAT44(uStack_6c,uStack_70) + -0x10 + local_68 * 0x10);
          uVar4 = QString::toIntegral_helper(QVar11,(bool *)&local_88,0x10);
          bVar8 = (uVar4 >> 0x10 & 1) == 0 | local_88._0_1_ ^ 1U;
        }
        piVar1 = (int *)CONCAT44(uStack_74,local_78);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x10,0x10);
          }
        }
        piVar1 = (int *)CONCAT44(uStack_54,local_58);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
          }
        }
        bVar2 = true;
        if (bVar8 == 0) goto LAB_00126861;
      }
    }
    if (((byte)this[0x10] & 8) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_KEY");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 != 0) goto LAB_00126764;
LAB_0012685f:
      bVar2 = true;
      goto LAB_00126861;
    }
LAB_00126764:
    if (((byte)this[0x10] & 1) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_MOUSE");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) goto LAB_0012685f;
    }
    if (((byte)this[0x10] & 2) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TOUCHPAD");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) goto LAB_0012685f;
    }
    if (((byte)this[0x10] & 4) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TOUCHSCREEN");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) goto LAB_0012685f;
    }
    if (((byte)this[0x10] & 0x40) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TABLET");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) goto LAB_0012685f;
    }
    if (((byte)this[0x10] & 0x80) != 0) {
      pcVar5 = (char *)udev_device_get_property_value(dev,"ID_INPUT_JOYSTICK");
      iVar3 = qstrcmp(pcVar5,"1");
      if (iVar3 == 0) goto LAB_0012685f;
    }
    if (((byte)this[0x10] & 0x10) != 0) {
      pcVar5 = (char *)udev_device_get_subsystem(dev);
      iVar3 = qstrcmp(pcVar5,"drm");
      if (iVar3 == 0) goto LAB_0012685f;
    }
  }
  bVar2 = false;
LAB_00126861:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QDeviceDiscoveryUDev::checkDeviceType(udev_device *dev)
{
    if (!dev)
        return false;

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEYBOARD"), "1") == 0 )) {
        const QString capabilities_key = QString::fromUtf8(udev_device_get_sysattr_value(dev, "capabilities/key"));
        const auto val = QStringView{capabilities_key}.split(u' ', Qt::SkipEmptyParts);
        if (!val.isEmpty()) {
            bool ok;
            unsigned long long keys = val.last().toULongLong(&ok, 16);
            if (ok) {
                // Tests if the letter Q is valid for the device.  We may want to alter this test, but it seems mostly reliable.
                bool test = (keys >> KEY_Q) & 1;
                if (test)
                    return true;
            }
        }
    }

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEY"), "1") == 0 ))
        return true;

    if ((m_types & Device_Mouse) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_MOUSE"), "1") == 0))
        return true;

    if ((m_types & Device_Touchpad) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHPAD"), "1") == 0))
        return true;

    if ((m_types & Device_Touchscreen) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHSCREEN"), "1") == 0))
        return true;

    if ((m_types & Device_Tablet) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TABLET"), "1") == 0))
        return true;

    if ((m_types & Device_Joystick) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_JOYSTICK"), "1") == 0))
        return true;

    if ((m_types & Device_DRM) && (qstrcmp(udev_device_get_subsystem(dev), "drm") == 0))
        return true;

    return false;
}